

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# itm-solver-equalities-01.cpp
# Opt level: O1

bool __thiscall
baryonyx::itm::
solver_equalities_01coeff<long_double,baryonyx::itm::minimize_tag,baryonyx::itm::default_cost_type<long_double>,true>
::
push_and_compute_update_row<baryonyx::bit_array,__gnu_cxx::__normal_iterator<int*,std::vector<int,std::allocator<int>>>>
          (solver_equalities_01coeff<long_double,baryonyx::itm::minimize_tag,baryonyx::itm::default_cost_type<long_double>,true>
           *this,bit_array *x,
          __normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_> first,
          __normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_> last,longdouble kappa,
          longdouble delta,longdouble theta,longdouble objective_amplifier)

{
  uint *args_1;
  linear_congruential_engine<unsigned_long,_16807UL,_0UL,_2147483647UL> *__g;
  bool bVar1;
  uint uVar2;
  uint r_size;
  uint uVar3;
  row_iterator prVar4;
  long lVar5;
  long lVar6;
  long lVar7;
  rc_data *__last;
  rc_data *__first;
  string_view fmt;
  string_view fmt_00;
  string_view fmt_01;
  string_view fmt_02;
  tuple<baryonyx::sparse_matrix<int>::row_value_*,_baryonyx::sparse_matrix<int>::row_value_*> it;
  int local_bc;
  int local_b8;
  uint local_b4;
  int *local_b0;
  bit_array *local_a8;
  int *local_a0;
  solver_equalities_01coeff<long_double,baryonyx::itm::minimize_tag,baryonyx::itm::default_cost_type<long_double>,true>
  *local_98;
  undefined8 local_90;
  undefined1 local_88 [20];
  longdouble local_74;
  longdouble local_68;
  longdouble local_58;
  longdouble local_48;
  
  local_74 = objective_amplifier;
  local_48 = kappa;
  local_58 = delta;
  local_68 = theta;
  fmt._M_str = "push-update-row {} {} {}\n";
  fmt._M_len = 0x19;
  debug_logger<true>::log<long_double,long_double,long_double>
            ((debug_logger<true> *)this,fmt,&local_48,&local_58,&local_68);
  if (first._M_current == last._M_current) {
    local_90 = 0;
  }
  else {
    local_98 = this + 0x10;
    local_90 = 0;
    local_a8 = x;
    local_a0 = last._M_current;
    do {
      local_bc = *first._M_current;
      sparse_matrix<int>::row((sparse_matrix<int> *)local_88,(int)local_98);
      if (local_88._8_8_ != local_88._0_8_) {
        lVar5 = *(long *)(this + 0x50);
        prVar4 = (row_iterator)local_88._8_8_;
        do {
          lVar7 = (long)prVar4->value * 0x10;
          *(longdouble *)(lVar5 + lVar7) = *(longdouble *)(lVar5 + lVar7) * local_68;
          prVar4 = prVar4 + 1;
        } while (prVar4 != (row_iterator)local_88._0_8_);
      }
      uVar2 = solver_equalities_01coeff<long_double,_baryonyx::itm::minimize_tag,_baryonyx::itm::default_cost_type<long_double>,_true>
              ::compute_reduced_costs<baryonyx::bit_array>
                        ((solver_equalities_01coeff<long_double,_baryonyx::itm::minimize_tag,_baryonyx::itm::default_cost_type<long_double>,_true>
                          *)this,(row_iterator)local_88._8_8_,(row_iterator)local_88._0_8_,x);
      if (uVar2 != 0) {
        lVar5 = *(long *)(this + 0x58);
        lVar7 = *(long *)(*(long *)(this + 0x70) + 8);
        lVar6 = 0;
        do {
          *(longdouble *)(lVar5 + lVar6) =
               *(longdouble *)(lVar5 + lVar6) +
               *(longdouble *)(lVar7 + (long)*(int *)(lVar5 + 0x10 + lVar6) * 0x10) * local_74;
          lVar6 = lVar6 + 0x20;
        } while ((ulong)uVar2 << 5 != lVar6);
      }
      r_size = uVar2;
      if (1 < (int)uVar2) {
        __g = *(linear_congruential_engine<unsigned_long,_16807UL,_0UL,_2147483647UL> **)(this + 8);
        __first = *(rc_data **)(this + 0x58);
        lVar5 = (long)(int)uVar2;
        local_b4 = uVar2;
        local_b0 = first._M_current;
        std::
        __introsort_loop<baryonyx::itm::solver_equalities_01coeff<long_double,baryonyx::itm::minimize_tag,baryonyx::itm::default_cost_type<long_double>,true>::rc_data*,long,__gnu_cxx::__ops::_Iter_comp_iter<baryonyx::itm::calculator_sort<baryonyx::itm::minimize_tag,baryonyx::itm::solver_equalities_01coeff<long_double,baryonyx::itm::minimize_tag,baryonyx::itm::default_cost_type<long_double>,true>::rc_data*>(baryonyx::itm::solver_equalities_01coeff<long_double,baryonyx::itm::minimize_tag,baryonyx::itm::default_cost_type<long_double>,true>::rc_data*,baryonyx::itm::solver_equalities_01coeff<long_double,baryonyx::itm::minimize_tag,baryonyx::itm::default_cost_type<long_double>,true>::rc_data*,std::linear_congruential_engine<unsigned_long,16807ul,0ul,2147483647ul>&)::_lambda(auto:1_const&,auto:2_const&)_1_>>
                  (__first,__first + lVar5,(int)LZCOUNT(lVar5) * 2 ^ 0x7e);
        std::
        __final_insertion_sort<baryonyx::itm::solver_equalities_01coeff<long_double,baryonyx::itm::minimize_tag,baryonyx::itm::default_cost_type<long_double>,true>::rc_data*,__gnu_cxx::__ops::_Iter_comp_iter<baryonyx::itm::calculator_sort<baryonyx::itm::minimize_tag,baryonyx::itm::solver_equalities_01coeff<long_double,baryonyx::itm::minimize_tag,baryonyx::itm::default_cost_type<long_double>,true>::rc_data*>(baryonyx::itm::solver_equalities_01coeff<long_double,baryonyx::itm::minimize_tag,baryonyx::itm::default_cost_type<long_double>,true>::rc_data*,baryonyx::itm::solver_equalities_01coeff<long_double,baryonyx::itm::minimize_tag,baryonyx::itm::default_cost_type<long_double>,true>::rc_data*,std::linear_congruential_engine<unsigned_long,16807ul,0ul,2147483647ul>&)::_lambda(auto:1_const&,auto:2_const&)_1_>>
                  (__first,__first + lVar5);
        __last = __first + 1;
        lVar5 = lVar5 * 0x20 + -0x20;
        do {
          if ((__first->value != __last->value) || (NAN(__first->value) || NAN(__last->value))) {
            std::
            shuffle<baryonyx::itm::solver_equalities_01coeff<long_double,baryonyx::itm::minimize_tag,baryonyx::itm::default_cost_type<long_double>,true>::rc_data*,std::linear_congruential_engine<unsigned_long,16807ul,0ul,2147483647ul>&>
                      (__first,__last,__g);
            __first = __last;
          }
          __last = __last + 1;
          lVar5 = lVar5 + -0x20;
        } while (lVar5 != 0);
        std::
        shuffle<baryonyx::itm::solver_equalities_01coeff<long_double,baryonyx::itm::minimize_tag,baryonyx::itm::default_cost_type<long_double>,true>::rc_data*,std::linear_congruential_engine<unsigned_long,16807ul,0ul,2147483647ul>&>
                  (__first,__last,__g);
        first._M_current = local_b0;
        r_size = local_b4;
      }
      args_1 = (uint *)(*(long *)(this + 0x60) + (long)local_bc * 4);
      uVar3 = *args_1;
      if ((int)r_size < (int)uVar3) {
        uVar3 = r_size;
      }
      local_b8 = uVar3 - 1;
      fmt_00._M_str = "constraints {}: {} = ";
      fmt_00._M_len = 0x15;
      debug_logger<true>::log<int,int>((debug_logger<true> *)this,fmt_00,&local_bc,(int *)args_1);
      if (0 < (int)r_size) {
        lVar5 = 0;
        do {
          fmt_01._M_str = "{} ({}) ";
          fmt_01._M_len = 8;
          debug_logger<true>::log<long_double,int>
                    ((debug_logger<true> *)this,fmt_01,
                     (longdouble *)(*(long *)(this + 0x58) + lVar5),
                     (int *)(*(long *)(this + 0x58) + 0x10 + lVar5));
          lVar5 = lVar5 + 0x20;
        } while ((ulong)uVar2 << 5 != lVar5);
      }
      fmt_02._M_str = " => Selected: {}\n";
      fmt_02._M_len = 0x11;
      debug_logger<true>::log<int>((debug_logger<true> *)this,fmt_02,&local_b8);
      x = local_a8;
      bVar1 = affect<baryonyx::itm::solver_equalities_01coeff<long_double,baryonyx::itm::minimize_tag,baryonyx::itm::default_cost_type<long_double>,true>,baryonyx::bit_array,baryonyx::sparse_matrix<int>::row_value*,long_double>
                        ((solver_equalities_01coeff<long_double,_baryonyx::itm::minimize_tag,_baryonyx::itm::default_cost_type<long_double>,_true>
                          *)this,local_a8,(row_value *)local_88._8_8_,local_bc,local_b8,r_size,
                         local_48,local_58);
      local_90 = CONCAT71((int7)((ulong)local_90 >> 8),(byte)local_90 | bVar1);
      first._M_current = first._M_current + 1;
    } while (first._M_current != local_a0);
  }
  return (bool)((byte)local_90 & 1);
}

Assistant:

bool push_and_compute_update_row(Xtype& x,
                                     Iterator first,
                                     Iterator last,
                                     Float kappa,
                                     Float delta,
                                     Float theta,
                                     Float objective_amplifier)
    {
        auto at_least_one_pi_changed{ false };

        logger::log("push-update-row {} {} {}\n", kappa, delta, theta);

        for (; first != last; ++first) {
            auto k = constraint(first);

            const auto it = ap.row(k);
            decrease_preference(std::get<0>(it), std::get<1>(it), theta);

            const auto r_size =
              compute_reduced_costs(std::get<0>(it), std::get<1>(it), x);

            // Before sort and select variables, we apply the push method: for
            // each reduces cost, we had the cost multiply with an objective
            // amplifier.

            for (int i = 0; i != r_size; ++i)
                R[i].value += objective_amplifier * c(R[i].id, x);

            calculator_sort<Mode>(R.get(), R.get() + r_size, rng);
            int selected = select_variables(r_size, b[k]);

            logger::log("constraints {}: {} = ", k, b[k]);

            for (int i = 0; i < r_size; ++i)
                logger::log("{} ({}) ", R[i].value, R[i].id);

            logger::log(" => Selected: {}\n", selected);

            auto pi_change = affect(
              *this, x, std::get<0>(it), k, selected, r_size, kappa, delta);

            at_least_one_pi_changed = at_least_one_pi_changed || pi_change;
        }

        return at_least_one_pi_changed;
    }